

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void MOJOSHADER_freeParseData(MOJOSHADER_parseData *_data)

{
  void *d;
  code *UNRECOVERED_JUMPTABLE;
  MOJOSHADER_parseData *data;
  long lVar1;
  long lVar2;
  
  if (_data == &MOJOSHADER_out_of_mem_data || _data == (MOJOSHADER_parseData *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = _data->free;
  if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
    UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
  }
  d = _data->malloc_data;
  (*UNRECOVERED_JUMPTABLE)(_data->mainfn,d);
  (*UNRECOVERED_JUMPTABLE)(_data->output,d);
  (*UNRECOVERED_JUMPTABLE)(_data->constants,d);
  (*UNRECOVERED_JUMPTABLE)(_data->swizzles,d);
  if (0 < _data->error_count) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->errors->error + lVar2),d);
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->errors->filename + lVar2),d);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar1 < _data->error_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->errors,d);
  if (0 < _data->uniform_count) {
    lVar2 = 0x10;
    lVar1 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->uniforms->type + lVar2),d);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar1 < _data->uniform_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->uniforms,d);
  if (0 < _data->attribute_count) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->attributes->usage + lVar2),d);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < _data->attribute_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->attributes,d);
  if (0 < _data->output_count) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->outputs->usage + lVar2),d);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < _data->output_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->outputs,d);
  if (0 < _data->sampler_count) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->samplers->type + lVar2),d);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar1 < _data->sampler_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->samplers,d);
  free_symbols(UNRECOVERED_JUMPTABLE,d,_data->symbols,_data->symbol_count);
  MOJOSHADER_freePreshader(_data->preshader);
  (*UNRECOVERED_JUMPTABLE)(_data,d);
  return;
}

Assistant:

void MOJOSHADER_freeParseData(const MOJOSHADER_parseData *_data)
{
    MOJOSHADER_parseData *data = (MOJOSHADER_parseData *) _data;
    if ((data == NULL) || (data == &MOJOSHADER_out_of_mem_data))
        return;  // no-op.

    MOJOSHADER_free f = (data->free == NULL) ? MOJOSHADER_internal_free : data->free;
    void *d = data->malloc_data;
    int i;

    // we don't f(data->profile), because that's internal static data.

    f((void *) data->mainfn, d);
    f((void *) data->output, d);
    f((void *) data->constants, d);
    f((void *) data->swizzles, d);

    for (i = 0; i < data->error_count; i++)
    {
        f((void *) data->errors[i].error, d);
        f((void *) data->errors[i].filename, d);
    } // for
    f((void *) data->errors, d);

    for (i = 0; i < data->uniform_count; i++)
        f((void *) data->uniforms[i].name, d);
    f((void *) data->uniforms, d);

    for (i = 0; i < data->attribute_count; i++)
        f((void *) data->attributes[i].name, d);
    f((void *) data->attributes, d);

    for (i = 0; i < data->output_count; i++)
        f((void *) data->outputs[i].name, d);
    f((void *) data->outputs, d);

    for (i = 0; i < data->sampler_count; i++)
        f((void *) data->samplers[i].name, d);
    f((void *) data->samplers, d);

    free_symbols(f, d, data->symbols, data->symbol_count);
    MOJOSHADER_freePreshader(data->preshader);

    f(data, d);
}